

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugInfoEntry.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDebugInfoEntry::extractFast
          (DWARFDebugInfoEntry *this,DWARFUnit *U,uint64_t *OffsetPtr,
          DWARFDataExtractor *DebugInfoData,uint64_t UEndOffset,uint32_t D)

{
  bool bVar1;
  uint64_t uVar2;
  DWARFAbbreviationDeclarationSet *this_00;
  DWARFAbbreviationDeclaration *this_01;
  AttributeSpec *AttrSpec;
  AttributeSpec *this_02;
  ulong uVar3;
  long lVar4;
  Optional<unsigned_long> OVar5;
  Optional<long> OVar6;
  
  uVar3 = *OffsetPtr;
  this->Offset = uVar3;
  this->Depth = D;
  if (UEndOffset <= uVar3) {
    return false;
  }
  if ((DebugInfoData->super_DataExtractor).Data.Length <= uVar3) {
    return false;
  }
  uVar2 = DataExtractor::getULEB128(&DebugInfoData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  if (uVar2 == 0) {
    this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
LAB_00aeed7c:
    bVar1 = true;
  }
  else {
    this_00 = DWARFUnit::getAbbreviations(U);
    if (this_00 == (DWARFAbbreviationDeclarationSet *)0x0) {
      this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
    }
    else {
      this_01 = DWARFAbbreviationDeclarationSet::getAbbreviationDeclaration(this_00,(uint32_t)uVar2)
      ;
      this->AbbrevDecl = this_01;
      if (this_01 != (DWARFAbbreviationDeclaration *)0x0) {
        OVar5 = DWARFAbbreviationDeclaration::getFixedAttributesByteSize(this_01,U);
        if (((undefined1  [16])OVar5.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          uVar3 = (ulong)(this->AbbrevDecl->AttributeSpecs).
                         super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                         super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                         .
                         super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                         .super_SmallVectorBase.Size;
          if (uVar3 == 0) {
            return true;
          }
          this_02 = (AttributeSpec *)
                    (this->AbbrevDecl->AttributeSpecs).
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.BeginX;
          lVar4 = uVar3 << 4;
          do {
            OVar6 = DWARFAbbreviationDeclaration::AttributeSpec::getByteSize(this_02,U);
            if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            {
              bVar1 = DWARFFormValue::skipValue
                                (this_02->Form,DebugInfoData->super_DataExtractor,OffsetPtr,
                                 (U->Header).FormParams);
              if (!bVar1) goto LAB_00aeed88;
            }
            else {
              *OffsetPtr = *OffsetPtr + OVar6.Storage.field_0.value;
            }
            this_02 = this_02 + 1;
            lVar4 = lVar4 + -0x10;
          } while (lVar4 != 0);
        }
        else {
          *OffsetPtr = *OffsetPtr + OVar5.Storage.field_0.value;
        }
        goto LAB_00aeed7c;
      }
    }
LAB_00aeed88:
    *OffsetPtr = this->Offset;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DWARFDebugInfoEntry::extractFast(const DWARFUnit &U, uint64_t *OffsetPtr,
                                      const DWARFDataExtractor &DebugInfoData,
                                      uint64_t UEndOffset, uint32_t D) {
  Offset = *OffsetPtr;
  Depth = D;
  if (Offset >= UEndOffset || !DebugInfoData.isValidOffset(Offset))
    return false;
  uint64_t AbbrCode = DebugInfoData.getULEB128(OffsetPtr);
  if (0 == AbbrCode) {
    // NULL debug tag entry.
    AbbrevDecl = nullptr;
    return true;
  }
  if (auto* Abbreviations = U.getAbbreviations()) { // XXX BINARYEN
    AbbrevDecl = Abbreviations->getAbbreviationDeclaration(AbbrCode);
  } else {
    AbbrevDecl = nullptr; // XXX BINARYEN
  }
  if (nullptr == AbbrevDecl) {
    // Restore the original offset.
    *OffsetPtr = Offset;
    return false;
  }
  // See if all attributes in this DIE have fixed byte sizes. If so, we can
  // just add this size to the offset to skip to the next DIE.
  if (Optional<size_t> FixedSize = AbbrevDecl->getFixedAttributesByteSize(U)) {
    *OffsetPtr += *FixedSize;
    return true;
  }

  // Skip all data in the .debug_info for the attributes
  for (const auto &AttrSpec : AbbrevDecl->attributes()) {
    // Check if this attribute has a fixed byte size.
    if (auto FixedSize = AttrSpec.getByteSize(U)) {
      // Attribute byte size if fixed, just add the size to the offset.
      *OffsetPtr += *FixedSize;
    } else if (!DWARFFormValue::skipValue(AttrSpec.Form, DebugInfoData,
                                          OffsetPtr, U.getFormParams())) {
      // We failed to skip this attribute's value, restore the original offset
      // and return the failure status.
      *OffsetPtr = Offset;
      return false;
    }
  }
  return true;
}